

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

int __thiscall xmrig::TcpServer::bind(TcpServer *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint16_t uVar1;
  int size;
  sockaddr_storage storage;
  int rc;
  undefined4 local_9c;
  undefined1 local_98 [2];
  uint16_t local_96;
  uint local_14;
  TcpServer *local_10;
  uint local_4;
  
  if (this->m_version == 0) {
    local_4 = 0xfffff448;
  }
  else {
    local_10 = this;
    uv_tcp_bind(this->m_tcp,&this->m_addr,0);
    local_14 = uv_listen(this->m_tcp,0x1ff,onConnection);
    local_4 = local_14;
    if (local_14 == 0) {
      if (this->m_port == 0) {
        memset(local_98,0,0x80);
        local_9c = 0x80;
        uv_tcp_getsockname(this->m_tcp,local_98,&local_9c);
        uVar1 = ntohs(local_96);
        this->m_port = uVar1;
      }
      local_4 = (uint)this->m_port;
    }
  }
  return local_4;
}

Assistant:

int xmrig::TcpServer::bind()
{
    if (!m_version) {
        return UV_EAI_ADDRFAMILY;
    }

    uv_tcp_bind(m_tcp, reinterpret_cast<const sockaddr*>(&m_addr), 0);

    const int rc = uv_listen(reinterpret_cast<uv_stream_t*>(m_tcp), 511, TcpServer::onConnection);
    if (rc != 0) {
        return rc;
    }

    if (!m_port) {
        sockaddr_storage storage = {};
        int size = sizeof(storage);

        uv_tcp_getsockname(m_tcp, reinterpret_cast<sockaddr*>(&storage), &size);

        m_port = ntohs(reinterpret_cast<sockaddr_in *>(&storage)->sin_port);
    }

    return m_port;
}